

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::texture_gather_offset_sampler_2d
               (NegativeTestContext *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ShaderType shaderType;
  string shaderSource_00;
  string shaderSource_01;
  string shaderSource_02;
  string shaderSource_03;
  string shaderSource_04;
  string shaderSource_05;
  string shaderSource_06;
  string shaderSource_07;
  string shaderSource_08;
  string shaderSource_09;
  string shaderSource_10;
  string shaderSource_11;
  string shaderSource_12;
  string shaderSource_13;
  string shaderSource_14;
  string shaderSource_15;
  string shaderSource_16;
  bool bVar2;
  char *__s;
  long *plVar3;
  size_type *psVar4;
  long lVar5;
  string shaderSource;
  allocator<char> local_271;
  long *local_270 [2];
  long local_260 [2];
  long *local_250 [2];
  long local_240 [2];
  long *local_230 [2];
  long local_220 [2];
  long *local_210 [2];
  long local_200 [2];
  long *local_1f0 [2];
  long local_1e0 [2];
  long *local_1d0 [2];
  long local_1c0 [2];
  long *local_1b0 [2];
  long local_1a0 [2];
  long *local_190 [2];
  long local_180 [2];
  long *local_170 [2];
  long local_160 [2];
  long *local_150 [2];
  long local_140 [2];
  long *local_130 [2];
  long local_120 [2];
  long *local_110 [2];
  long local_100 [2];
  long *local_f0 [2];
  long local_e0 [2];
  long *local_d0 [2];
  long local_c0 [2];
  long *local_b0 [2];
  long local_a0 [2];
  long *local_90 [2];
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  paVar1 = &shaderSource.field_2;
  shaderSource._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&shaderSource,"textureGatherOffset - sampler2D","");
  NegativeTestContext::beginSection(ctx,&shaderSource);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)shaderSource._M_dataplus._M_p != paVar1) {
    operator_delete(shaderSource._M_dataplus._M_p,shaderSource.field_2._M_allocated_capacity + 1);
  }
  lVar5 = 0;
  do {
    shaderType = *(ShaderType *)
                  ((long)&NegativeTestShared::(anonymous_namespace)::s_shaders + lVar5);
    bVar2 = NegativeTestContext::isShaderSupported(ctx,shaderType);
    if (bVar2) {
      __s = glu::getShaderTypeName(shaderType);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_50,__s,&local_271);
      plVar3 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x1c79853);
      psVar4 = (size_type *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar4) {
        shaderSource.field_2._M_allocated_capacity = *psVar4;
        shaderSource.field_2._8_8_ = plVar3[3];
        shaderSource._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        shaderSource.field_2._M_allocated_capacity = *psVar4;
        shaderSource._M_dataplus._M_p = (pointer)*plVar3;
      }
      shaderSource._M_string_length = plVar3[1];
      *plVar3 = (long)psVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      NegativeTestContext::beginSection(ctx,&shaderSource);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)shaderSource._M_dataplus._M_p != paVar1) {
        operator_delete(shaderSource._M_dataplus._M_p,shaderSource.field_2._M_allocated_capacity + 1
                       );
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGatherOffset_abi_cxx11_
                (&shaderSource,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType
                 ,SHADERTYPE_VERTEX,0x28,TYPE_FLOAT,TYPE_INT_VEC2,TYPE_LAST,
                 (DataType)shaderSource._M_dataplus._M_p);
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_70,shaderSource._M_dataplus._M_p,
                 shaderSource._M_dataplus._M_p + shaderSource._M_string_length);
      shaderSource_00._M_string_length = shaderSource._M_string_length;
      shaderSource_00._M_dataplus._M_p = shaderSource._M_dataplus._M_p;
      shaderSource_00.field_2._M_allocated_capacity = shaderSource.field_2._M_allocated_capacity;
      shaderSource_00.field_2._8_8_ = shaderSource.field_2._8_8_;
      verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                   (ShaderType)local_70[0],shaderSource_00);
      if (local_70[0] != local_60) {
        operator_delete(local_70[0],local_60[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)shaderSource._M_dataplus._M_p != paVar1) {
        operator_delete(shaderSource._M_dataplus._M_p,shaderSource.field_2._M_allocated_capacity + 1
                       );
      }
      NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGatherOffset_abi_cxx11_
                (&shaderSource,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType
                 ,SHADERTYPE_VERTEX,0x28,TYPE_FLOAT_VEC2,TYPE_INT,TYPE_LAST,
                 (DataType)shaderSource._M_dataplus._M_p);
      local_90[0] = local_80;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_90,shaderSource._M_dataplus._M_p,
                 shaderSource._M_dataplus._M_p + shaderSource._M_string_length);
      shaderSource_01._M_string_length = shaderSource._M_string_length;
      shaderSource_01._M_dataplus._M_p = shaderSource._M_dataplus._M_p;
      shaderSource_01.field_2._M_allocated_capacity = shaderSource.field_2._M_allocated_capacity;
      shaderSource_01.field_2._8_8_ = shaderSource.field_2._8_8_;
      verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                   (ShaderType)local_90[0],shaderSource_01);
      if (local_90[0] != local_80) {
        operator_delete(local_90[0],local_80[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)shaderSource._M_dataplus._M_p != paVar1) {
        operator_delete(shaderSource._M_dataplus._M_p,shaderSource.field_2._M_allocated_capacity + 1
                       );
      }
      NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGatherOffset_abi_cxx11_
                (&shaderSource,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType
                 ,SHADERTYPE_VERTEX,0x28,TYPE_FLOAT,TYPE_INT_VEC2,TYPE_INT,
                 (DataType)shaderSource._M_dataplus._M_p);
      local_b0[0] = local_a0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_b0,shaderSource._M_dataplus._M_p,
                 shaderSource._M_dataplus._M_p + shaderSource._M_string_length);
      shaderSource_02._M_string_length = shaderSource._M_string_length;
      shaderSource_02._M_dataplus._M_p = shaderSource._M_dataplus._M_p;
      shaderSource_02.field_2._M_allocated_capacity = shaderSource.field_2._M_allocated_capacity;
      shaderSource_02.field_2._8_8_ = shaderSource.field_2._8_8_;
      verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                   (ShaderType)local_b0[0],shaderSource_02);
      if (local_b0[0] != local_a0) {
        operator_delete(local_b0[0],local_a0[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)shaderSource._M_dataplus._M_p != paVar1) {
        operator_delete(shaderSource._M_dataplus._M_p,shaderSource.field_2._M_allocated_capacity + 1
                       );
      }
      NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGatherOffset_abi_cxx11_
                (&shaderSource,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType
                 ,SHADERTYPE_VERTEX,0x28,TYPE_FLOAT_VEC2,TYPE_INT,TYPE_INT,
                 (DataType)shaderSource._M_dataplus._M_p);
      local_d0[0] = local_c0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_d0,shaderSource._M_dataplus._M_p,
                 shaderSource._M_dataplus._M_p + shaderSource._M_string_length);
      shaderSource_03._M_string_length = shaderSource._M_string_length;
      shaderSource_03._M_dataplus._M_p = shaderSource._M_dataplus._M_p;
      shaderSource_03.field_2._M_allocated_capacity = shaderSource.field_2._M_allocated_capacity;
      shaderSource_03.field_2._8_8_ = shaderSource.field_2._8_8_;
      verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                   (ShaderType)local_d0[0],shaderSource_03);
      if (local_d0[0] != local_c0) {
        operator_delete(local_d0[0],local_c0[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)shaderSource._M_dataplus._M_p != paVar1) {
        operator_delete(shaderSource._M_dataplus._M_p,shaderSource.field_2._M_allocated_capacity + 1
                       );
      }
      NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGatherOffset_abi_cxx11_
                (&shaderSource,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType
                 ,SHADERTYPE_VERTEX,0x28,TYPE_FLOAT_VEC2,TYPE_INT_VEC2,TYPE_FLOAT,
                 (DataType)shaderSource._M_dataplus._M_p);
      local_f0[0] = local_e0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_f0,shaderSource._M_dataplus._M_p,
                 shaderSource._M_dataplus._M_p + shaderSource._M_string_length);
      shaderSource_04._M_string_length = shaderSource._M_string_length;
      shaderSource_04._M_dataplus._M_p = shaderSource._M_dataplus._M_p;
      shaderSource_04.field_2._M_allocated_capacity = shaderSource.field_2._M_allocated_capacity;
      shaderSource_04.field_2._8_8_ = shaderSource.field_2._8_8_;
      verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                   (ShaderType)local_f0[0],shaderSource_04);
      if (local_f0[0] != local_e0) {
        operator_delete(local_f0[0],local_e0[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)shaderSource._M_dataplus._M_p != paVar1) {
        operator_delete(shaderSource._M_dataplus._M_p,shaderSource.field_2._M_allocated_capacity + 1
                       );
      }
      NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGatherOffset_abi_cxx11_
                (&shaderSource,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType
                 ,SHADERTYPE_VERTEX,0x35,TYPE_FLOAT,TYPE_INT_VEC2,TYPE_LAST,
                 (DataType)shaderSource._M_dataplus._M_p);
      local_110[0] = local_100;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_110,shaderSource._M_dataplus._M_p,
                 shaderSource._M_dataplus._M_p + shaderSource._M_string_length);
      shaderSource_05._M_string_length = shaderSource._M_string_length;
      shaderSource_05._M_dataplus._M_p = shaderSource._M_dataplus._M_p;
      shaderSource_05.field_2._M_allocated_capacity = shaderSource.field_2._M_allocated_capacity;
      shaderSource_05.field_2._8_8_ = shaderSource.field_2._8_8_;
      verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                   (ShaderType)local_110[0],shaderSource_05);
      if (local_110[0] != local_100) {
        operator_delete(local_110[0],local_100[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)shaderSource._M_dataplus._M_p != paVar1) {
        operator_delete(shaderSource._M_dataplus._M_p,shaderSource.field_2._M_allocated_capacity + 1
                       );
      }
      NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGatherOffset_abi_cxx11_
                (&shaderSource,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType
                 ,SHADERTYPE_VERTEX,0x35,TYPE_FLOAT_VEC2,TYPE_INT,TYPE_LAST,
                 (DataType)shaderSource._M_dataplus._M_p);
      local_130[0] = local_120;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_130,shaderSource._M_dataplus._M_p,
                 shaderSource._M_dataplus._M_p + shaderSource._M_string_length);
      shaderSource_06._M_string_length = shaderSource._M_string_length;
      shaderSource_06._M_dataplus._M_p = shaderSource._M_dataplus._M_p;
      shaderSource_06.field_2._M_allocated_capacity = shaderSource.field_2._M_allocated_capacity;
      shaderSource_06.field_2._8_8_ = shaderSource.field_2._8_8_;
      verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                   (ShaderType)local_130[0],shaderSource_06);
      if (local_130[0] != local_120) {
        operator_delete(local_130[0],local_120[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)shaderSource._M_dataplus._M_p != paVar1) {
        operator_delete(shaderSource._M_dataplus._M_p,shaderSource.field_2._M_allocated_capacity + 1
                       );
      }
      NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGatherOffset_abi_cxx11_
                (&shaderSource,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType
                 ,SHADERTYPE_VERTEX,0x35,TYPE_FLOAT,TYPE_INT_VEC2,TYPE_INT,
                 (DataType)shaderSource._M_dataplus._M_p);
      local_150[0] = local_140;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_150,shaderSource._M_dataplus._M_p,
                 shaderSource._M_dataplus._M_p + shaderSource._M_string_length);
      shaderSource_07._M_string_length = shaderSource._M_string_length;
      shaderSource_07._M_dataplus._M_p = shaderSource._M_dataplus._M_p;
      shaderSource_07.field_2._M_allocated_capacity = shaderSource.field_2._M_allocated_capacity;
      shaderSource_07.field_2._8_8_ = shaderSource.field_2._8_8_;
      verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                   (ShaderType)local_150[0],shaderSource_07);
      if (local_150[0] != local_140) {
        operator_delete(local_150[0],local_140[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)shaderSource._M_dataplus._M_p != paVar1) {
        operator_delete(shaderSource._M_dataplus._M_p,shaderSource.field_2._M_allocated_capacity + 1
                       );
      }
      NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGatherOffset_abi_cxx11_
                (&shaderSource,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType
                 ,SHADERTYPE_VERTEX,0x35,TYPE_FLOAT_VEC2,TYPE_INT,TYPE_INT,
                 (DataType)shaderSource._M_dataplus._M_p);
      local_170[0] = local_160;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_170,shaderSource._M_dataplus._M_p,
                 shaderSource._M_dataplus._M_p + shaderSource._M_string_length);
      shaderSource_08._M_string_length = shaderSource._M_string_length;
      shaderSource_08._M_dataplus._M_p = shaderSource._M_dataplus._M_p;
      shaderSource_08.field_2._M_allocated_capacity = shaderSource.field_2._M_allocated_capacity;
      shaderSource_08.field_2._8_8_ = shaderSource.field_2._8_8_;
      verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                   (ShaderType)local_170[0],shaderSource_08);
      if (local_170[0] != local_160) {
        operator_delete(local_170[0],local_160[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)shaderSource._M_dataplus._M_p != paVar1) {
        operator_delete(shaderSource._M_dataplus._M_p,shaderSource.field_2._M_allocated_capacity + 1
                       );
      }
      NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGatherOffset_abi_cxx11_
                (&shaderSource,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType
                 ,SHADERTYPE_VERTEX,0x35,TYPE_FLOAT_VEC2,TYPE_INT_VEC2,TYPE_FLOAT,
                 (DataType)shaderSource._M_dataplus._M_p);
      local_190[0] = local_180;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_190,shaderSource._M_dataplus._M_p,
                 shaderSource._M_dataplus._M_p + shaderSource._M_string_length);
      shaderSource_09._M_string_length = shaderSource._M_string_length;
      shaderSource_09._M_dataplus._M_p = shaderSource._M_dataplus._M_p;
      shaderSource_09.field_2._M_allocated_capacity = shaderSource.field_2._M_allocated_capacity;
      shaderSource_09.field_2._8_8_ = shaderSource.field_2._8_8_;
      verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                   (ShaderType)local_190[0],shaderSource_09);
      if (local_190[0] != local_180) {
        operator_delete(local_190[0],local_180[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)shaderSource._M_dataplus._M_p != paVar1) {
        operator_delete(shaderSource._M_dataplus._M_p,shaderSource.field_2._M_allocated_capacity + 1
                       );
      }
      NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGatherOffset_abi_cxx11_
                (&shaderSource,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType
                 ,SHADERTYPE_VERTEX,0x3c,TYPE_FLOAT,TYPE_INT_VEC2,TYPE_LAST,
                 (DataType)shaderSource._M_dataplus._M_p);
      local_1b0[0] = local_1a0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1b0,shaderSource._M_dataplus._M_p,
                 shaderSource._M_dataplus._M_p + shaderSource._M_string_length);
      shaderSource_10._M_string_length = shaderSource._M_string_length;
      shaderSource_10._M_dataplus._M_p = shaderSource._M_dataplus._M_p;
      shaderSource_10.field_2._M_allocated_capacity = shaderSource.field_2._M_allocated_capacity;
      shaderSource_10.field_2._8_8_ = shaderSource.field_2._8_8_;
      verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                   (ShaderType)local_1b0[0],shaderSource_10);
      if (local_1b0[0] != local_1a0) {
        operator_delete(local_1b0[0],local_1a0[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)shaderSource._M_dataplus._M_p != paVar1) {
        operator_delete(shaderSource._M_dataplus._M_p,shaderSource.field_2._M_allocated_capacity + 1
                       );
      }
      NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGatherOffset_abi_cxx11_
                (&shaderSource,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType
                 ,SHADERTYPE_VERTEX,0x3c,TYPE_FLOAT_VEC2,TYPE_INT,TYPE_LAST,
                 (DataType)shaderSource._M_dataplus._M_p);
      local_1d0[0] = local_1c0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1d0,shaderSource._M_dataplus._M_p,
                 shaderSource._M_dataplus._M_p + shaderSource._M_string_length);
      shaderSource_11._M_string_length = shaderSource._M_string_length;
      shaderSource_11._M_dataplus._M_p = shaderSource._M_dataplus._M_p;
      shaderSource_11.field_2._M_allocated_capacity = shaderSource.field_2._M_allocated_capacity;
      shaderSource_11.field_2._8_8_ = shaderSource.field_2._8_8_;
      verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                   (ShaderType)local_1d0[0],shaderSource_11);
      if (local_1d0[0] != local_1c0) {
        operator_delete(local_1d0[0],local_1c0[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)shaderSource._M_dataplus._M_p != paVar1) {
        operator_delete(shaderSource._M_dataplus._M_p,shaderSource.field_2._M_allocated_capacity + 1
                       );
      }
      NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGatherOffset_abi_cxx11_
                (&shaderSource,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType
                 ,SHADERTYPE_VERTEX,0x3c,TYPE_FLOAT,TYPE_INT_VEC2,TYPE_INT,
                 (DataType)shaderSource._M_dataplus._M_p);
      local_1f0[0] = local_1e0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1f0,shaderSource._M_dataplus._M_p,
                 shaderSource._M_dataplus._M_p + shaderSource._M_string_length);
      shaderSource_12._M_string_length = shaderSource._M_string_length;
      shaderSource_12._M_dataplus._M_p = shaderSource._M_dataplus._M_p;
      shaderSource_12.field_2._M_allocated_capacity = shaderSource.field_2._M_allocated_capacity;
      shaderSource_12.field_2._8_8_ = shaderSource.field_2._8_8_;
      verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                   (ShaderType)local_1f0[0],shaderSource_12);
      if (local_1f0[0] != local_1e0) {
        operator_delete(local_1f0[0],local_1e0[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)shaderSource._M_dataplus._M_p != paVar1) {
        operator_delete(shaderSource._M_dataplus._M_p,shaderSource.field_2._M_allocated_capacity + 1
                       );
      }
      NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGatherOffset_abi_cxx11_
                (&shaderSource,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType
                 ,SHADERTYPE_VERTEX,0x3c,TYPE_FLOAT_VEC2,TYPE_INT,TYPE_INT,
                 (DataType)shaderSource._M_dataplus._M_p);
      local_210[0] = local_200;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_210,shaderSource._M_dataplus._M_p,
                 shaderSource._M_dataplus._M_p + shaderSource._M_string_length);
      shaderSource_13._M_string_length = shaderSource._M_string_length;
      shaderSource_13._M_dataplus._M_p = shaderSource._M_dataplus._M_p;
      shaderSource_13.field_2._M_allocated_capacity = shaderSource.field_2._M_allocated_capacity;
      shaderSource_13.field_2._8_8_ = shaderSource.field_2._8_8_;
      verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                   (ShaderType)local_210[0],shaderSource_13);
      if (local_210[0] != local_200) {
        operator_delete(local_210[0],local_200[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)shaderSource._M_dataplus._M_p != paVar1) {
        operator_delete(shaderSource._M_dataplus._M_p,shaderSource.field_2._M_allocated_capacity + 1
                       );
      }
      NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGatherOffset_abi_cxx11_
                (&shaderSource,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType
                 ,SHADERTYPE_VERTEX,0x3c,TYPE_FLOAT_VEC2,TYPE_INT_VEC2,TYPE_FLOAT,
                 (DataType)shaderSource._M_dataplus._M_p);
      local_230[0] = local_220;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_230,shaderSource._M_dataplus._M_p,
                 shaderSource._M_dataplus._M_p + shaderSource._M_string_length);
      shaderSource_14._M_string_length = shaderSource._M_string_length;
      shaderSource_14._M_dataplus._M_p = shaderSource._M_dataplus._M_p;
      shaderSource_14.field_2._M_allocated_capacity = shaderSource.field_2._M_allocated_capacity;
      shaderSource_14.field_2._8_8_ = shaderSource.field_2._8_8_;
      verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                   (ShaderType)local_230[0],shaderSource_14);
      if (local_230[0] != local_220) {
        operator_delete(local_230[0],local_220[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)shaderSource._M_dataplus._M_p != paVar1) {
        operator_delete(shaderSource._M_dataplus._M_p,shaderSource.field_2._M_allocated_capacity + 1
                       );
      }
      NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGatherOffset_abi_cxx11_
                (&shaderSource,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType
                 ,SHADERTYPE_VERTEX,0x2c,TYPE_FLOAT_VEC2,TYPE_INT_VEC2,TYPE_LAST,
                 (DataType)shaderSource._M_dataplus._M_p);
      local_250[0] = local_240;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_250,shaderSource._M_dataplus._M_p,
                 shaderSource._M_dataplus._M_p + shaderSource._M_string_length);
      shaderSource_15._M_string_length = shaderSource._M_string_length;
      shaderSource_15._M_dataplus._M_p = shaderSource._M_dataplus._M_p;
      shaderSource_15.field_2._M_allocated_capacity = shaderSource.field_2._M_allocated_capacity;
      shaderSource_15.field_2._8_8_ = shaderSource.field_2._8_8_;
      verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                   (ShaderType)local_250[0],shaderSource_15);
      if (local_250[0] != local_240) {
        operator_delete(local_250[0],local_240[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)shaderSource._M_dataplus._M_p != paVar1) {
        operator_delete(shaderSource._M_dataplus._M_p,shaderSource.field_2._M_allocated_capacity + 1
                       );
      }
      NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGatherOffset_abi_cxx11_
                (&shaderSource,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType
                 ,SHADERTYPE_VERTEX,0x2c,TYPE_FLOAT_VEC2,TYPE_INT_VEC2,TYPE_INT,
                 (DataType)shaderSource._M_dataplus._M_p);
      local_270[0] = local_260;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_270,shaderSource._M_dataplus._M_p,
                 shaderSource._M_dataplus._M_p + shaderSource._M_string_length);
      shaderSource_16._M_string_length = shaderSource._M_string_length;
      shaderSource_16._M_dataplus._M_p = shaderSource._M_dataplus._M_p;
      shaderSource_16.field_2._M_allocated_capacity = shaderSource.field_2._M_allocated_capacity;
      shaderSource_16.field_2._8_8_ = shaderSource.field_2._8_8_;
      verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                   (ShaderType)local_270[0],shaderSource_16);
      if (local_270[0] != local_260) {
        operator_delete(local_270[0],local_260[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)shaderSource._M_dataplus._M_p != paVar1) {
        operator_delete(shaderSource._M_dataplus._M_p,shaderSource.field_2._M_allocated_capacity + 1
                       );
      }
      NegativeTestContext::endSection(ctx);
    }
    lVar5 = lVar5 + 4;
  } while (lVar5 != 0x18);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void texture_gather_offset_sampler_2d (NegativeTestContext& ctx)
{
	ctx.beginSection("textureGatherOffset - sampler2D");
	for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
	{
		if (ctx.isShaderSupported(s_shaders[shaderNdx]))
		{
			ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
			{
				const std::string shaderSource(genShaderSourceTextureGatherOffset(ctx, s_shaders[shaderNdx], FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP, glu::TYPE_SAMPLER_2D, glu::TYPE_FLOAT, glu::TYPE_INT_VEC2));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGatherOffset(ctx, s_shaders[shaderNdx], FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP, glu::TYPE_SAMPLER_2D, glu::TYPE_FLOAT_VEC2, glu::TYPE_INT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGatherOffset(ctx, s_shaders[shaderNdx], FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP, glu::TYPE_SAMPLER_2D, glu::TYPE_FLOAT, glu::TYPE_INT_VEC2, glu::TYPE_INT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGatherOffset(ctx, s_shaders[shaderNdx], FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP, glu::TYPE_SAMPLER_2D, glu::TYPE_FLOAT_VEC2, glu::TYPE_INT, glu::TYPE_INT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGatherOffset(ctx, s_shaders[shaderNdx], FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP, glu::TYPE_SAMPLER_2D, glu::TYPE_FLOAT_VEC2, glu::TYPE_INT_VEC2, glu::TYPE_FLOAT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGatherOffset(ctx, s_shaders[shaderNdx], FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP, glu::TYPE_INT_SAMPLER_2D, glu::TYPE_FLOAT, glu::TYPE_INT_VEC2));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGatherOffset(ctx, s_shaders[shaderNdx], FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP, glu::TYPE_INT_SAMPLER_2D, glu::TYPE_FLOAT_VEC2, glu::TYPE_INT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGatherOffset(ctx, s_shaders[shaderNdx], FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP, glu::TYPE_INT_SAMPLER_2D, glu::TYPE_FLOAT, glu::TYPE_INT_VEC2, glu::TYPE_INT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGatherOffset(ctx, s_shaders[shaderNdx], FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP, glu::TYPE_INT_SAMPLER_2D, glu::TYPE_FLOAT_VEC2, glu::TYPE_INT, glu::TYPE_INT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGatherOffset(ctx, s_shaders[shaderNdx], FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP, glu::TYPE_INT_SAMPLER_2D, glu::TYPE_FLOAT_VEC2, glu::TYPE_INT_VEC2, glu::TYPE_FLOAT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGatherOffset(ctx, s_shaders[shaderNdx], FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP, glu::TYPE_UINT_SAMPLER_2D, glu::TYPE_FLOAT, glu::TYPE_INT_VEC2));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGatherOffset(ctx, s_shaders[shaderNdx], FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP, glu::TYPE_UINT_SAMPLER_2D, glu::TYPE_FLOAT_VEC2, glu::TYPE_INT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGatherOffset(ctx, s_shaders[shaderNdx], FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP, glu::TYPE_UINT_SAMPLER_2D, glu::TYPE_FLOAT, glu::TYPE_INT_VEC2, glu::TYPE_INT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGatherOffset(ctx, s_shaders[shaderNdx], FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP, glu::TYPE_UINT_SAMPLER_2D, glu::TYPE_FLOAT_VEC2, glu::TYPE_INT, glu::TYPE_INT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGatherOffset(ctx, s_shaders[shaderNdx], FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP, glu::TYPE_UINT_SAMPLER_2D, glu::TYPE_FLOAT_VEC2, glu::TYPE_INT_VEC2, glu::TYPE_FLOAT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGatherOffset(ctx, s_shaders[shaderNdx], FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP, glu::TYPE_SAMPLER_3D, glu::TYPE_FLOAT_VEC2, glu::TYPE_INT_VEC2));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGatherOffset(ctx, s_shaders[shaderNdx], FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP, glu::TYPE_SAMPLER_3D, glu::TYPE_FLOAT_VEC2, glu::TYPE_INT_VEC2, glu::TYPE_INT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			ctx.endSection();
		}
	}
	ctx.endSection();
}